

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.hpp
# Opt level: O0

TypedTermList __thiscall Kernel::SelectedEquality::biggerSide(SelectedEquality *this)

{
  ResultOf<TL::Get<0,_TL::List<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)>_>,_const_TL::Get<0,_Ts>_&>
  t;
  TermList sort;
  Literal *in_RDI;
  SelectedEquality *in_stack_ffffffffffffffd0;
  TypedTermList local_10;
  
  t = Lib::
      Coproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      match<Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedSummand_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedIntegerEquality_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedUninterpretedEquality_const&)_1_>
                ();
  literal(in_stack_ffffffffffffffd0);
  sort = SortHelper::getEqualityArgumentSort(in_RDI);
  TypedTermList::TypedTermList(&local_10,(TermList)t._content,(SortId)sort._content);
  return local_10;
}

Assistant:

TypedTermList biggerSide() const 
    { return TypedTermList(
        _inner.match(
          [](SelectedSummand               const& x) { return x.selectedAtom(); },
          [](SelectedIntegerEquality       const& x) { return x.biggerSide(); },
          [](SelectedUninterpretedEquality const& x) { return x.biggerSide(); }), 
        SortHelper::getEqualityArgumentSort(literal())); }